

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O2

void test_2d_static<0ul,1ul,1ul,30ul>(void)

{
  int line;
  int j;
  unsigned_long *puVar1;
  char *expr2;
  int j_2;
  unsigned_long *puVar2;
  int j_1;
  unsigned_long *local_d0;
  size_t true_idx;
  int *local_c0;
  int dptr [31];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x1f;
  dptr[1] = 0;
  true_idx = 0x1f;
  puVar2 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",puVar2,&true_idx);
  for (puVar1 = (unsigned_long *)0x0; puVar1 != (unsigned_long *)0x1e;
      puVar1 = (unsigned_long *)((long)puVar1 + 1)) {
    local_d0 = puVar1;
    true_idx = (size_t)puVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x2d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_d0,&true_idx);
    local_c0 = dptr + true_idx;
    local_d0 = puVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x2f,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_d0
               ,&local_c0);
    *(undefined4 *)puVar2 = 0x2a;
    local_d0 = (unsigned_long *)CONCAT44(local_d0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x33,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)puVar2,
               (int *)&local_d0);
    puVar2 = (unsigned_long *)((long)puVar2 + 4);
  }
  puVar2 = (unsigned_long *)dptr;
  for (puVar1 = (unsigned_long *)0x0; puVar1 != (unsigned_long *)0x1f;
      puVar1 = (unsigned_long *)((long)puVar1 + 1)) {
    local_d0 = puVar1;
    true_idx = (size_t)puVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x3c,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_d0,&true_idx);
    local_c0 = dptr + true_idx;
    local_d0 = puVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x3e,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_d0
               ,&local_c0);
    if (puVar1 == (unsigned_long *)0x1e) {
      *(int *)puVar2 = 0x18;
      local_d0 = (unsigned_long *)CONCAT44(local_d0._4_4_,0x18);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x4d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)puVar2,
                 (int *)&local_d0);
    }
    puVar2 = (unsigned_long *)((long)puVar2 + 4);
  }
  puVar2 = (unsigned_long *)dptr;
  for (puVar1 = (unsigned_long *)0x0; puVar1 != (unsigned_long *)0x1f;
      puVar1 = (unsigned_long *)((long)puVar1 + 1)) {
    local_d0 = puVar1;
    true_idx = (size_t)puVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x57,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_d0,&true_idx);
    local_c0 = dptr + true_idx;
    local_d0 = puVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x59,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_d0
               ,&local_c0);
    if (puVar1 == (unsigned_long *)0x1e) {
      local_d0 = (unsigned_long *)CONCAT44(local_d0._4_4_,0x18);
      expr2 = "24";
      line = 100;
    }
    else {
      local_d0 = (unsigned_long *)CONCAT44(local_d0._4_4_,0x2a);
      expr2 = "42";
      line = 0x6a;
    }
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])",expr2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,line,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)puVar2,
               (int *)&local_d0);
    puVar2 = (unsigned_long *)((long)puVar2 + 4);
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}